

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantic_checker.cpp
# Opt level: O1

void __thiscall mocker::Annotator::operator()(Annotator *this,FuncCallExpr *node)

{
  long lVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  bool bVar4;
  int iVar5;
  mapped_type *pmVar6;
  pointer psVar7;
  mapped_type *pmVar8;
  CompileError *pCVar9;
  mapped_type *pmVar10;
  UnresolvableSymbol *this_02;
  ulong uVar11;
  long lVar12;
  shared_ptr<mocker::ast::FuncDecl> funcDecl;
  SymTbl local_58;
  VisitorBase<false,_true> local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  FuncCallExpr *local_38;
  
  setInstance(this,node);
  getFuncDecl((Annotator *)&stack0xffffffffffffffb8,(FuncCallExpr *)this);
  if (local_48._vptr_VisitorBase == (_func_int **)0x0) {
    this_02 = (UnresolvableSymbol *)__cxa_allocate_exception(0x68);
    local_58.root.super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         (node->identifier).super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    pmVar10 = std::__detail::
              _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::at((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    *)this->pos,(key_type *)&local_58);
    UnresolvableSymbol::UnresolvableSymbol
              (this_02,&pmVar10->first,&pmVar10->second,
               &((node->identifier).
                 super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                val);
    __cxa_throw(this_02,&UnresolvableSymbol::typeinfo,UnresolvableSymbol::~UnresolvableSymbol);
  }
  local_58.root.super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (node->identifier).super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  pmVar6 = std::__detail::
           _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Declaration>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Declaration>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Declaration>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Declaration>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&this->ctx->associatedDecl,(key_type *)&local_58);
  (pmVar6->super___shared_ptr<mocker::ast::Declaration,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)local_48._vptr_VisitorBase;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(pmVar6->super___shared_ptr<mocker::ast::Declaration,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount,&stack0xffffffffffffffc0);
  if ((long)(node->args).
            super__Vector_base<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(node->args).
            super__Vector_base<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
      (long)((__weak_count<(__gnu_cxx::_Lock_policy)2> *)((long)local_48._vptr_VisitorBase + 0x40))
            ->_M_pi -
      (long)(((enable_shared_from_this<mocker::ast::ASTNode> *)
             ((long)local_48._vptr_VisitorBase + 0x38))->_M_weak_this).
            super___weak_ptr<mocker::ast::ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr) {
    psVar7 = (node->args).
             super__Vector_base<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((node->args).
        super__Vector_base<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != psVar7) {
      lVar12 = 0;
      uVar11 = 0;
      do {
        local_58.root.super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             *(element_type **)
              ((long)&(psVar7->
                      super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr + lVar12);
        local_58.root.super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi =
             *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
              ((long)&(psVar7->
                      super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>).
                      _M_refcount._M_pi + lVar12);
        if (local_58.root.super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_58.root.super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_58.root.
                  super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_58.root.super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_58.root.
                  super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi)->_M_use_count + 1;
          }
        }
        visit(this,(shared_ptr<mocker::ast::ASTNode> *)&local_58);
        if (local_58.root.super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_58.root.
                     super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        lVar1 = *(long *)((long)&((((enable_shared_from_this<mocker::ast::ASTNode> *)
                                   (local_48._vptr_VisitorBase + 7))->_M_weak_this).
                                  super___weak_ptr<mocker::ast::ASTNode,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->_vptr_ASTNode + lVar12);
        local_58.root.super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             *(element_type **)
              ((long)&(((node->args).
                        super__Vector_base<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr + lVar12);
        pmVar8 = std::__detail::
                 _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Type>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Type>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Type>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Type>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&this->ctx->exprType,(key_type *)&local_58);
        bVar4 = assignable(this,(shared_ptr<mocker::ast::Type> *)(lVar1 + 0x18),pmVar8);
        if (!bVar4) {
          pCVar9 = (CompileError *)__cxa_allocate_exception(0x48);
          local_58.root.super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               = (element_type *)node;
          pmVar10 = std::__detail::
                    _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::at((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)this->pos,(key_type *)&local_58);
          CompileError::CompileError(pCVar9,pmVar10->first,pmVar10->second);
          *(undefined ***)pCVar9 = &PTR__CompileError_001f3a60;
          __cxa_throw(pCVar9,&InvalidFunctionCall::typeinfo,CompileError::~CompileError);
        }
        uVar11 = uVar11 + 1;
        psVar7 = (node->args).
                 super__Vector_base<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar12 = lVar12 + 0x10;
      } while (uVar11 < (ulong)((long)(node->args).
                                      super__Vector_base<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)psVar7 >> 4
                               ));
    }
    iVar5 = std::__cxx11::string::compare
                      ((char *)&((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
                                (local_48._vptr_VisitorBase + 5))->_M_pi[1]._M_use_count);
    if (iVar5 == 0) {
      SymTbl::lookUp(&local_58,(ScopeID *)&this->ctx->syms,(string *)&this->scopeResiding);
      this_01._M_pi =
           local_58.root.super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      peVar2 = local_58.root.super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      if (local_58.root.super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_58.root.super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_58.root.super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_58.root.super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_58.root.super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      if (local_58.root.super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_58.root.
                   super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      local_58.root.super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<mocker::ast::UserDefinedType,std::allocator<mocker::ast::UserDefinedType>,std::shared_ptr<mocker::ast::Identifier>&>
                (&local_58.root.
                  super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 (UserDefinedType **)&local_58,
                 (allocator<mocker::ast::UserDefinedType> *)&stack0xffffffffffffffc8,
                 (shared_ptr<mocker::ast::Identifier> *)&(peVar2->syms)._M_h._M_element_count);
      std::__shared_ptr<mocker::ast::UserDefinedType,(__gnu_cxx::_Lock_policy)2>::
      _M_enable_shared_from_this_with<mocker::ast::UserDefinedType,mocker::ast::UserDefinedType>
                ((__shared_ptr<mocker::ast::UserDefinedType,(__gnu_cxx::_Lock_policy)2> *)&local_58,
                 (UserDefinedType *)
                 local_58.root.super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr);
      local_38 = node;
      pmVar8 = std::__detail::
               _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Type>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Type>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Type>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Type>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&this->ctx->exprType,(key_type *)&stack0xffffffffffffffc8);
      _Var3._M_pi = local_58.root.
                    super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
      peVar2 = local_58.root.super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      local_58.root.super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_58.root.super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      this_00 = (pmVar8->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
      (pmVar8->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
           (element_type *)peVar2;
      (pmVar8->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
           = _Var3._M_pi;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      if (local_58.root.super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_58.root.
                   super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (this_01._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01._M_pi);
      }
    }
    else {
      local_58.root.super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)node;
      pmVar8 = std::__detail::
               _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Type>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Type>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Type>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Type>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&this->ctx->exprType,(key_type *)&local_58);
      (pmVar8->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
           (element_type *)
           (((element_type *)((long)local_48._vptr_VisitorBase + 0x18))->super_ASTNode).
           _vptr_ASTNode;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(pmVar8->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount,
                 (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)local_48._vptr_VisitorBase + 0x20));
    }
    if (local_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40._M_pi);
    }
    return;
  }
  pCVar9 = (CompileError *)__cxa_allocate_exception(0x48);
  local_58.root.super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)node;
  pmVar10 = std::__detail::
            _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::at((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  *)this->pos,(key_type *)&local_58);
  CompileError::CompileError(pCVar9,pmVar10->first,pmVar10->second);
  *(undefined ***)pCVar9 = &PTR__CompileError_001f3a60;
  __cxa_throw(pCVar9,&InvalidFunctionCall::typeinfo,CompileError::~CompileError);
}

Assistant:

void operator()(ast::FuncCallExpr &node) const override {
    setInstance(node);
    auto funcDecl = getFuncDecl(node);
    if (!funcDecl)
      throw UnresolvableSymbol(pos.at(node.identifier->getID()),
                               node.identifier->val);

    ctx.associatedDecl[node.identifier->getID()] = funcDecl;

    if (node.args.size() != funcDecl->formalParameters.size())
      throw InvalidFunctionCall(pos.at(node.getID()));
    for (std::size_t i = 0; i < node.args.size(); ++i) {
      visit(node.args[i]);
      if (!assignable(funcDecl->formalParameters[i]->type,
                      ctx.exprType[node.args[i]->getID()]))
        throw InvalidFunctionCall(pos.at(node.getID()));
    }

    if (funcDecl->identifier->val == "_ctor_") {
      auto decl = std::static_pointer_cast<ast::ClassDecl>(
          ctx.syms.lookUp(scopeResiding, node.identifier->val));
      ctx.exprType[node.getID()] =
          std::make_shared<ast::UserDefinedType>(decl->identifier);
    } else {
      ctx.exprType[node.getID()] = funcDecl->retType;
    }
  }